

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-schema-to-grammar.cpp
# Opt level: O2

void __thiscall
SchemaConverter::SchemaConverter
          (SchemaConverter *this,
          function<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *fetch_json,bool dotall)

{
  _Rb_tree_header *p_Var1;
  mapped_type *pmVar2;
  allocator<char> local_51;
  key_type local_50;
  
  std::
  function<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&this->_fetch_json,fetch_json);
  this->_dotall = dotall;
  p_Var1 = &(this->_rules)._M_t._M_impl.super__Rb_tree_header;
  (this->_rules)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_rules)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_rules)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_rules)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->_rules)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->_refs)._M_h._M_buckets = &(this->_refs)._M_h._M_single_bucket;
  (this->_refs)._M_h._M_bucket_count = 1;
  (this->_refs)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->_refs)._M_h._M_element_count = 0;
  (this->_refs)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->_refs)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->_refs)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->_refs_being_resolved)._M_h._M_buckets = &(this->_refs_being_resolved)._M_h._M_single_bucket
  ;
  (this->_refs_being_resolved)._M_h._M_bucket_count = 1;
  (this->_refs_being_resolved)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->_refs_being_resolved)._M_h._M_element_count = 0;
  (this->_refs_being_resolved)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->_refs_being_resolved)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->_refs_being_resolved)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->_errors).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_errors).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_errors).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_warnings).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_warnings).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_warnings).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"space",&local_51);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->_rules,&local_50);
  std::__cxx11::string::_M_assign((string *)pmVar2);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

SchemaConverter(
        const std::function<json(const std::string &)> & fetch_json,
        bool dotall)
          : _fetch_json(fetch_json), _dotall(dotall)
    {
        _rules["space"] = SPACE_RULE;
    }